

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O3

int shared_getaddr(int id,char **address)

{
  int iVar1;
  int iVar2;
  int i;
  char segname [10];
  int local_18;
  char local_12 [10];
  
  iVar1 = 0x9a;
  if ((shared_gt != (SHARED_GTAB *)0x0) && (shared_lt != (SHARED_LTAB *)0x0)) {
    local_12[0] = 'h';
    local_12[1] = '\0';
    snprintf(local_12 + 1,9,"%d",id);
    iVar2 = smem_open(local_12,0,&local_18);
    iVar1 = 0x97;
    if (iVar2 == 0) {
      *address = (char *)(shared_lt[local_18].p + 3);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int     shared_getaddr(int id, char **address)
 { int i;
   char segname[10];

   if (NULL == shared_gt) return(SHARED_NOTINIT);       /* not initialized */
   if (NULL == shared_lt) return(SHARED_NOTINIT);       /* not initialized */
 
   strcpy(segname,"h");
   snprintf(segname+1,9,"%d", id);
 
   if (smem_open(segname,0,&i)) return(SHARED_BADARG);
 
   *address = ((char *)(((DAL_SHM_SEGHEAD *)(shared_lt[i].p + 1)) + 1));
 /*  smem_close(i); */
   return(SHARED_OK);
 }